

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen.cpp
# Opt level: O0

Read<signed_char> __thiscall Omega_h::get_edge_codes(Omega_h *this,Mesh *mesh)

{
  Mesh *this_00;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  undefined1 local_19;
  Mesh *local_18;
  Mesh *mesh_local;
  Read<signed_char> *edge_cand_codes;
  
  local_19 = 0;
  local_18 = mesh;
  mesh_local = (Mesh *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"collapse_code",&local_41);
  Mesh::get_array<signed_char>((Mesh *)this,(Int)mesh,(string *)0x1);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this_00 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"collapse_code",&local_79);
  Mesh::remove_tag(this_00,1,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

static Read<I8> get_edge_codes(Mesh* mesh) {
  auto edge_cand_codes = mesh->get_array<I8>(EDGE, "collapse_code");
  mesh->remove_tag(EDGE, "collapse_code");
  return edge_cand_codes;
}